

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseEntryMid
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  _Elt_pointer pPVar1;
  StringPiece message;
  StringPiece message_00;
  ParseType local_1c;
  
  if (type == ENTRY_SEPARATOR) {
    Advance(this);
    local_1c = VALUE;
    pPVar1 = (this->stack_).c.
             super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pPVar1 == (this->stack_).c.
                  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
                (&(this->stack_).c,&local_1c);
    }
    else {
      *pPVar1 = VALUE;
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
    }
    Status::Status(__return_storage_ptr__);
  }
  else if (type == UNKNOWN) {
    message.length_ = 0x22;
    message.ptr_ = "Expected : between key:value pair.";
    ReportUnknown(__return_storage_ptr__,this,message);
  }
  else {
    message_00.length_ = 0x22;
    message_00.ptr_ = "Expected : between key:value pair.";
    ReportFailure(__return_storage_ptr__,this,message_00);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseEntryMid(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected : between key:value pair.");
  }
  if (type == ENTRY_SEPARATOR) {
    Advance();
    stack_.push(VALUE);
    return util::Status();
  }
  return ReportFailure("Expected : between key:value pair.");
}